

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.h
# Opt level: O0

void __thiscall
Js::PropertyDescriptor::PropertyDescriptor(PropertyDescriptor *this,PropertyDescriptor *other)

{
  void **ppvVar1;
  PropertyDescriptor *other_local;
  PropertyDescriptor *this_local;
  
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)other);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Value,*ppvVar1);
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&other->Getter);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Getter,*ppvVar1);
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&other->Setter);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Setter,*ppvVar1);
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&other->originalVar)
  ;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->originalVar,*ppvVar1);
  this->writableSpecified = (Type)(other->writableSpecified & 1);
  this->enumerableSpecified = (Type)(other->enumerableSpecified & 1);
  this->configurableSpecified = (Type)(other->configurableSpecified & 1);
  this->valueSpecified = (Type)(other->valueSpecified & 1);
  this->getterSpecified = (Type)(other->getterSpecified & 1);
  this->setterSpecified = (Type)(other->setterSpecified & 1);
  this->Writable = (Type)(other->Writable & 1);
  this->Enumerable = (Type)(other->Enumerable & 1);
  this->Configurable = (Type)(other->Configurable & 1);
  this->fromProxy = (Type)(other->fromProxy & 1);
  return;
}

Assistant:

PropertyDescriptor(const PropertyDescriptor& other)
            :Value(other.Value),
            Getter(other.Getter),
            Setter(other.Setter),
            originalVar(other.originalVar),
            writableSpecified(other.writableSpecified),
            enumerableSpecified(other.enumerableSpecified),
            configurableSpecified(other.configurableSpecified),
            valueSpecified(other.valueSpecified),
            getterSpecified(other.getterSpecified),
            setterSpecified(other.setterSpecified),
            Writable(other.Writable),
            Enumerable(other.Enumerable),
            Configurable(other.Configurable),
            fromProxy(other.fromProxy)
        {
        }